

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

Vec_Int_t * Gia_ManCorrCreateRemapping(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int local_2c;
  int i;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPairs;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar3 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pRepr = Gia_ManCi(p,iVar1 + local_2c);
      bVar3 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjId(p,pRepr);
    pObj_00 = Gia_ObjReprObj(p,iVar1);
    if ((pObj_00 != (Gia_Obj_t *)0x0) && (iVar1 = Gia_ObjIsConst0(pObj_00), iVar1 == 0)) {
      iVar1 = Gia_ObjId(p,pRepr);
      iVar1 = Gia_ObjFailed(p,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecCorr.c"
                        ,0x177,"Vec_Int_t *Gia_ManCorrCreateRemapping(Gia_Man_t *)");
        }
        iVar1 = Gia_ObjCioId(pObj_00);
        iVar2 = Gia_ManPiNum(p);
        Vec_IntPush(p_00,iVar1 - iVar2);
        Vec_IntPush(p_00,local_2c);
      }
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCorrCreateRemapping( Gia_Man_t * p )
{
    Vec_Int_t * vPairs;
    Gia_Obj_t * pObj, * pRepr;
    int i;
    vPairs = Vec_IntAlloc( 100 );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
//        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjIsFailedPair(p, Gia_ObjId(p, pRepr), Gia_ObjId(p, pObj)) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", Gia_ObjId(p,pObj), Gia_ObjId(p, pRepr) );
        // remember the pair
        Vec_IntPush( vPairs, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}